

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::majorUpdatePrimal(HEkkDual *this)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  bool bVar3;
  uint32_t uVar4;
  EdgeWeightMode EVar5;
  int iVar6;
  int iVar7;
  HVector *column;
  double *pdVar8;
  double *pdVar9;
  element_type *peVar10;
  HEkk *pHVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  HighsTask *pHVar15;
  HighsSplitDeque *pHVar16;
  long *plVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  HEkkDualRHS *this_00;
  HVector_ptr *ppHVar26;
  double *pdVar27;
  MFinish *pMVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double new_pivotal_edge_weight;
  double Kai;
  double *dseArray;
  double *colArray;
  double *local_work_infeasibility;
  double *mixArray;
  TaskGroup local_d8;
  vector<double,_std::allocator<double>_> *local_c8;
  pointer local_c0;
  anon_class_40_5_b11b0fa6 local_b8;
  HEkkDualRHS *local_90;
  double local_88;
  long *local_80;
  MFinish *local_78;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [24];
  double local_40 [2];
  
  this_00 = &this->dualRHS;
  if ((this->dualRHS).workCount < 0) {
    local_58._0_8_ =
         (this->col_BFRT).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_b8.edge_weight = (vector<double,_std::allocator<double>_> *)local_58;
    local_60 = (this->dualRHS).work_infeasibility.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_b8.new_pivotal_edge_weight = (double *)&local_60;
    uVar23 = (ulong)this->solver_num_row;
    local_b8.colArray = (double **)this;
    local_90 = this_00;
    if ((long)uVar23 < 0x65) {
      if (0 < this->solver_num_row) {
        pdVar27 = this->baseValue;
        pdVar8 = this->baseLower;
        bVar3 = (this->ekk_instance_->info_).store_squared_primal_infeasibility;
        pdVar9 = this->baseUpper;
        uVar22 = 0;
        do {
          dVar30 = pdVar27[uVar22] - (double)(&((HEkk *)local_58._0_8_)->callback_)[uVar22];
          pdVar27[uVar22] = dVar30;
          dVar29 = pdVar8[uVar22] - dVar30;
          if (dVar29 <= this->Tp) {
            dVar30 = dVar30 - pdVar9[uVar22];
            dVar29 = (double)(-(ulong)(this->Tp < dVar30) & (ulong)dVar30);
          }
          if (bVar3 == false) {
            dVar29 = ABS(dVar29);
          }
          else {
            dVar29 = dVar29 * dVar29;
          }
          local_60[uVar22] = dVar29;
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
    }
    else {
      HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
      plVar17 = (long *)__tls_get_addr(&PTR_00449ef0);
      local_d8.workerDeque = (HighsSplitDeque *)*plVar17;
      local_d8.dequeHead = ((local_d8.workerDeque)->ownerData).head;
      do {
        pHVar16 = local_d8.workerDeque;
        uVar19 = uVar23 >> 1 & 0x7fffffff;
        uVar21 = ((local_d8.workerDeque)->ownerData).head;
        uVar22 = (ulong)uVar21;
        uVar18 = (uint)uVar23;
        if (uVar22 < 0x2000) {
          ((local_d8.workerDeque)->ownerData).head = uVar21 + 1;
          ((local_d8.workerDeque)->taskArray)._M_elems[uVar22].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData =
               &PTR_operator___004495b0;
          *(HighsInt *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 8) =
               (HighsInt)uVar19;
          *(uint *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0xc) = uVar18;
          pHVar15 = ((local_d8.workerDeque)->taskArray)._M_elems + uVar22;
          pHVar15->taskData[0x10] = 'd';
          pHVar15->taskData[0x11] = '\0';
          pHVar15->taskData[0x12] = '\0';
          pHVar15->taskData[0x13] = '\0';
          *(anon_class_40_5_b11b0fa6 **)
           (((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0x18) = &local_b8;
          if (((local_d8.workerDeque)->ownerData).allStolenCopy == true) {
            uVar4 = ((local_d8.workerDeque)->ownerData).head;
            ((local_d8.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 CONCAT44(uVar4 - 1,uVar4);
            ((local_d8.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((local_d8.workerDeque)->ownerData).splitCopy = ((local_d8.workerDeque)->ownerData).head
            ;
            ((local_d8.workerDeque)->ownerData).allStolenCopy = false;
            if ((((local_d8.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((local_d8.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar10 = ((local_d8.workerDeque)->ownerData).workerBunk.
                      super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            LOCK();
            _Var2._M_i = (peVar10->haveJobs).super___atomic_base<int>._M_i;
            (peVar10->haveJobs).super___atomic_base<int>._M_i =
                 (peVar10->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var2._M_i < ((local_d8.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((local_d8.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_d8.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(local_d8.workerDeque);
          }
        }
        else {
          if ((((local_d8.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((local_d8.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(local_d8.workerDeque);
          }
          puVar1 = &(pHVar16->ownerData).head;
          *puVar1 = *puVar1 + 1;
          ::highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__0&>
                    ((HighsInt)uVar19,uVar18,(anon_class_24_3_f997d2ca *)&local_b8,100);
        }
        uVar23 = uVar19;
      } while (0xc9 < uVar18);
      if (1 < uVar18) {
        pdVar12 = ((local_b8.edge_weight)->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar27 = *(double **)((long)local_b8.colArray + 0x68);
        pdVar8 = *(double **)((long)local_b8.colArray + 0x58);
        bVar3 = ((*(HEkk **)((long)local_b8.colArray + 0x10))->info_).
                store_squared_primal_infeasibility;
        pdVar13 = (pointer)*local_b8.new_pivotal_edge_weight;
        uVar23 = 0;
        do {
          dVar30 = pdVar27[uVar23] - pdVar12[uVar23];
          pdVar27[uVar23] = dVar30;
          dVar29 = pdVar8[uVar23] - dVar30;
          if (dVar29 <= *(double *)((long)local_b8.colArray + 0xb8)) {
            dVar30 = dVar30 - (*(double **)((long)local_b8.colArray + 0x60))[uVar23];
            dVar29 = (double)(-(ulong)(*(double *)((long)local_b8.colArray + 0xb8) < dVar30) &
                             (ulong)dVar30);
          }
          if (bVar3 == false) {
            dVar29 = ABS(dVar29);
          }
          else {
            dVar29 = dVar29 * dVar29;
          }
          pdVar13[uVar23] = dVar29;
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      ::highs::parallel::TaskGroup::taskWait(&local_d8);
      this_00 = local_90;
      ::highs::parallel::TaskGroup::~TaskGroup(&local_d8);
    }
    if (((this->edge_weight_mode == kSteepestEdge) ||
        ((this->edge_weight_mode == kDevex && (this->new_devex_framework == false)))) &&
       (0 < this->multi_nFinish)) {
      local_c8 = &this->ekk_instance_->dual_edge_weight_;
      pMVar28 = this->multi_finish;
      local_80 = (long *)__tls_get_addr(&PTR_00449ef0);
      lVar24 = 0;
      local_78 = pMVar28;
      do {
        local_c0 = (pointer)pMVar28[lVar24].EdWt;
        local_68 = ((pMVar28[lVar24].col_aq)->array).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (this->edge_weight_mode == kSteepestEdge) {
          local_70 = ((pMVar28[lVar24].row_ep)->array).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_88 = -2.0 / pMVar28[lVar24].alpha_row;
          uVar23 = (ulong)this->solver_num_row;
          local_b8.colArray = &local_68;
          local_b8.edge_weight = local_c8;
          local_b8.new_pivotal_edge_weight = (double *)&local_c0;
          local_b8.Kai = &local_88;
          local_b8.dseArray = &local_70;
          if ((long)uVar23 < 0x65) {
            this_00 = local_90;
            pMVar28 = local_78;
            if (0 < this->solver_num_row) {
              pdVar12 = (local_c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              uVar22 = 0;
              do {
                dVar29 = ((double)local_c0 * local_68[uVar22] + local_88 * local_70[uVar22]) *
                         local_68[uVar22] + pdVar12[uVar22];
                if (dVar29 <= 0.0001) {
                  dVar29 = 0.0001;
                }
                pdVar12[uVar22] = dVar29;
                uVar22 = uVar22 + 1;
              } while (uVar23 != uVar22);
            }
          }
          else {
            HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
            local_d8.workerDeque = (HighsSplitDeque *)*local_80;
            local_d8.dequeHead = ((local_d8.workerDeque)->ownerData).head;
            do {
              pHVar16 = local_d8.workerDeque;
              uVar19 = uVar23 >> 1 & 0x7fffffff;
              uVar21 = ((local_d8.workerDeque)->ownerData).head;
              uVar22 = (ulong)uVar21;
              uVar18 = (uint)uVar23;
              if (uVar22 < 0x2000) {
                ((local_d8.workerDeque)->ownerData).head = uVar21 + 1;
                ((local_d8.workerDeque)->taskArray)._M_elems[uVar22].metadata.stealer.
                super___atomic_base<unsigned_long>._M_i = 0;
                *(undefined ***)((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData =
                     &PTR_operator___00449610;
                *(HighsInt *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 8) =
                     (HighsInt)uVar19;
                *(uint *)(((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0xc) =
                     uVar18;
                pHVar15 = ((local_d8.workerDeque)->taskArray)._M_elems + uVar22;
                pHVar15->taskData[0x10] = 'd';
                pHVar15->taskData[0x11] = '\0';
                pHVar15->taskData[0x12] = '\0';
                pHVar15->taskData[0x13] = '\0';
                *(anon_class_40_5_b11b0fa6 **)
                 (((local_d8.workerDeque)->taskArray)._M_elems[uVar22].taskData + 0x18) = &local_b8;
                if (((local_d8.workerDeque)->ownerData).allStolenCopy == true) {
                  uVar4 = ((local_d8.workerDeque)->ownerData).head;
                  ((local_d8.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                       CONCAT44(uVar4 - 1,uVar4);
                  ((local_d8.workerDeque)->stealerData).allStolen._M_base._M_i = false;
                  ((local_d8.workerDeque)->ownerData).splitCopy =
                       ((local_d8.workerDeque)->ownerData).head;
                  ((local_d8.workerDeque)->ownerData).allStolenCopy = false;
                  if ((((local_d8.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                    ((local_d8.workerDeque)->splitRequest)._M_base._M_i = false;
                  }
                  peVar10 = ((local_d8.workerDeque)->ownerData).workerBunk.
                            super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  LOCK();
                  _Var2._M_i = (peVar10->haveJobs).super___atomic_base<int>._M_i;
                  (peVar10->haveJobs).super___atomic_base<int>._M_i =
                       (peVar10->haveJobs).super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                  if (_Var2._M_i < ((local_d8.workerDeque)->ownerData).numWorkers + -1) {
                    HighsSplitDeque::WorkerBunk::publishWork
                              (((local_d8.workerDeque)->ownerData).workerBunk.
                               super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,local_d8.workerDeque);
                  }
                }
                else {
                  HighsSplitDeque::growShared(local_d8.workerDeque);
                }
              }
              else {
                if ((((local_d8.workerDeque)->ownerData).splitCopy < 0x2000) &&
                   (((local_d8.workerDeque)->ownerData).allStolenCopy == false)) {
                  HighsSplitDeque::growShared(local_d8.workerDeque);
                }
                puVar1 = &(pHVar16->ownerData).head;
                *puVar1 = *puVar1 + 1;
                ::highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__1&>
                          ((HighsInt)uVar19,uVar18,&local_b8,100);
              }
              uVar23 = uVar19;
            } while (0xc9 < uVar18);
            if (1 < uVar18) {
              pdVar12 = *local_b8.colArray;
              pdVar13 = *local_b8.dseArray;
              pdVar14 = ((local_b8.edge_weight)->super__Vector_base<double,_std::allocator<double>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar23 = 0;
              do {
                dVar29 = ((double)*local_b8.new_pivotal_edge_weight * pdVar12[uVar23] +
                         *local_b8.Kai * pdVar13[uVar23]) * pdVar12[uVar23] + pdVar14[uVar23];
                if (dVar29 <= 0.0001) {
                  dVar29 = 0.0001;
                }
                pdVar14[uVar23] = dVar29;
                uVar23 = uVar23 + 1;
              } while (uVar19 != uVar23);
            }
            ::highs::parallel::TaskGroup::taskWait(&local_d8);
            ::highs::parallel::TaskGroup::~TaskGroup(&local_d8);
            this_00 = local_90;
            pMVar28 = local_78;
          }
        }
        else {
          iVar20 = this->solver_num_row;
          if (0 < (long)iVar20) {
            pdVar12 = (local_c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar25 = 0;
            do {
              dVar30 = (double)local_c0 * local_68[lVar25] * local_68[lVar25];
              dVar29 = pdVar12[lVar25];
              if (dVar30 <= dVar29) {
                dVar30 = dVar29;
              }
              pdVar12[lVar25] = dVar30;
              lVar25 = lVar25 + 1;
            } while (iVar20 != lVar25);
          }
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < this->multi_nFinish);
    }
  }
  else {
    HEkkDualRHS::updatePrimal(this_00,&this->col_BFRT,1.0);
    HEkkDualRHS::updateInfeasList(this_00,&this->col_BFRT);
    if (0 < this->multi_nFinish) {
      ppHVar26 = &this->multi_finish[0].col_aq;
      lVar24 = 0;
      do {
        column = *ppHVar26;
        if (this->edge_weight_mode == kDevex) {
          if (this->new_devex_framework == false) {
            HEkk::updateDualDevexWeights(this->ekk_instance_,column,(double)ppHVar26[-2]);
          }
        }
        else if (this->edge_weight_mode == kSteepestEdge) {
          HEkk::updateDualSteepestEdgeWeights
                    (this->ekk_instance_,this->row_out,this->variable_in,column,(double)ppHVar26[-2]
                     ,-2.0 / (double)ppHVar26[-6],
                     (ppHVar26[-1]->array).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        HEkkDualRHS::updateInfeasList(this_00,column);
        lVar24 = lVar24 + 1;
        ppHVar26 = ppHVar26 + 0xf;
      } while (lVar24 < this->multi_nFinish);
    }
  }
  uVar21 = this->multi_nFinish;
  if (0 < (int)uVar21) {
    pdVar27 = &this->multi_finish[0].basicValue;
    lVar24 = 0;
    do {
      HEkkDualRHS::updatePivots
                (this_00,*(int *)(pdVar27 + -5),
                 (this->baseValue[*(int *)(pdVar27 + -5)] - pdVar27[-1]) + *pdVar27);
      lVar24 = lVar24 + 1;
      uVar21 = this->multi_nFinish;
      pdVar27 = pdVar27 + 0xf;
    } while (lVar24 < (int)uVar21);
  }
  EVar5 = this->edge_weight_mode;
  if (EVar5 == kDevex) {
    if (this->new_devex_framework != false) goto LAB_00357f02;
  }
  else if (EVar5 != kSteepestEdge) goto LAB_00357f02;
  if (0 < (int)uVar21) {
    pHVar11 = this->ekk_instance_;
    iVar20 = this->num_devex_iterations;
    lVar24 = 0;
    uVar23 = 0;
    do {
      iVar6 = this->multi_finish[uVar23].row_out;
      dVar29 = this->multi_finish[uVar23].EdWt;
      pdVar12 = ((this->multi_finish[uVar23].col_aq)->array).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (EVar5 == kSteepestEdge) {
        if (uVar23 != 0) {
          pdVar13 = ((this->multi_finish[uVar23].row_ep)->array).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar30 = this->multi_finish[uVar23].alpha_row;
          pdVar14 = (pHVar11->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar25 = 0;
          do {
            iVar7 = *(int *)((long)&this->multi_finish[0].row_out + lVar25);
            dVar31 = pdVar12[iVar7];
            dVar31 = (dVar29 * dVar31 + pdVar13[iVar7] * (-2.0 / dVar30)) * dVar31 + pdVar14[iVar7];
            if (dVar31 <= 0.0001) {
              dVar31 = 0.0001;
            }
            pdVar14[iVar7] = dVar31;
            lVar25 = lVar25 + 0x78;
          } while (lVar24 != lVar25);
        }
        (pHVar11->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = dVar29;
      }
      else {
        if (uVar23 != 0) {
          pdVar13 = (pHVar11->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar25 = 0;
          do {
            iVar7 = *(int *)((long)&this->multi_finish[0].row_out + lVar25);
            dVar30 = pdVar12[iVar6];
            dVar30 = dVar29 * dVar30 * dVar30;
            dVar31 = pdVar13[iVar7];
            if (dVar30 <= dVar31) {
              dVar30 = dVar31;
            }
            pdVar13[iVar7] = dVar30;
            lVar25 = lVar25 + 0x78;
          } while (lVar24 != lVar25);
        }
        (pHVar11->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = dVar29;
        iVar20 = iVar20 + 1;
        this->num_devex_iterations = iVar20;
      }
      uVar23 = uVar23 + 1;
      lVar24 = lVar24 + 0x78;
    } while (uVar23 != uVar21);
  }
LAB_00357f02:
  local_58._8_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 8),"999","");
  checkNonUnitWeightError(this,(string *)(local_58 + 8));
  if ((double *)local_58._8_8_ != local_40) {
    operator_delete((void *)local_58._8_8_);
  }
  return;
}

Assistant:

void HEkkDual::majorUpdatePrimal() {
  const bool updatePrimal_inDense = dualRHS.workCount < 0;
  if (updatePrimal_inDense) {
    // Dense update of primal values, infeasibility list and
    // non-pivotal edge weights
    const double* mixArray = col_BFRT.array.data();
    double* local_work_infeasibility = dualRHS.work_infeasibility.data();
    // #pragma omp parallel for schedule(static)
    highs::parallel::for_each(
        0, solver_num_row,
        [&](HighsInt start, HighsInt end) {
          for (HighsInt iRow = start; iRow < end; iRow++) {
            baseValue[iRow] -= mixArray[iRow];
            const double value = baseValue[iRow];
            const double less = baseLower[iRow] - value;
            const double more = value - baseUpper[iRow];
            double infeas = less > Tp ? less : (more > Tp ? more : 0);
            if (ekk_instance_.info_.store_squared_primal_infeasibility)
              local_work_infeasibility[iRow] = infeas * infeas;
            else
              local_work_infeasibility[iRow] = fabs(infeas);
          }
        },
        100);

    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
        (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
      // Dense update of any edge weights (except weights for pivotal rows)
      std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
      for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
        // multi_finish[iFn].EdWt has already been transformed to correspond to
        // the new basis
        const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
        const double* colArray = multi_finish[iFn].col_aq->array.data();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          // Update steepest edge weights
          const double* dseArray = multi_finish[iFn].row_ep->array.data();
          const double Kai = -2 / multi_finish[iFn].alpha_row;
          // #pragma omp parallel for schedule(static)
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt iRow = start; iRow < end; iRow++) {
                  const double aa_iRow = colArray[iRow];
                  edge_weight[iRow] +=
                      aa_iRow * (new_pivotal_edge_weight * aa_iRow +
                                 Kai * dseArray[iRow]);
                  edge_weight[iRow] =
                      max(kMinDualSteepestEdgeWeight, edge_weight[iRow]);
                }
              },
              100);
        } else {
          // Update Devex weights
          for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
            const double aa_iRow = colArray[iRow];
            edge_weight[iRow] = max(
                edge_weight[iRow], new_pivotal_edge_weight * aa_iRow * aa_iRow);
          }
        }
      }
    }
  } else {
    // Sparse update of primal values, infeasibility list and
    // non-pivotal edge weights
    dualRHS.updatePrimal(&col_BFRT, 1);
    dualRHS.updateInfeasList(&col_BFRT);

    // Sparse update of any edge weights and infeasList. Weights for
    // rows pivotal in this set of MI are updated, but this is based
    // on the previous updated weights not the computed pivotal weight
    // that's known. For the rows pivotal in this set of MI, the
    // weights will be over-written in the next section of code.
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      const double new_pivotal_edge_weight = finish->EdWt;
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Update steepest edge weights
        HVector* Row = finish->row_ep;
        double Kai = -2 / finish->alpha_row;
        ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, Col,
                                                    new_pivotal_edge_weight,
                                                    Kai, Row->array.data());
      } else if (edge_weight_mode == EdgeWeightMode::kDevex &&
                 !new_devex_framework) {
        // Update Devex weights
        ekk_instance_.updateDualDevexWeights(Col, new_pivotal_edge_weight);
      }
      dualRHS.updateInfeasList(Col);
    }
  }

  // Update primal value for the rows pivotal in this set of MI
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HighsInt iRow = finish->row_out;
    double value = baseValue[iRow] - finish->basicBound + finish->basicValue;
    dualRHS.updatePivots(iRow, value);
  }

  // Update any edge weights for the rows pivotal in this set of MI.
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
      (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
    // Update weights for the pivots using the computed values.
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      const HighsInt iRow = multi_finish[iFn].row_out;
      const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
      const double* colArray = multi_finish[iFn].col_aq->array.data();
      // The weight for this pivot is known, but weights for rows
      // pivotal earlier need to be updated
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Steepest edge
        const double* dseArray = multi_finish[iFn].row_ep->array.data();
        double Kai = -2 / multi_finish[iFn].alpha_row;
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          double value = colArray[jRow];
          edge_weight[jRow] +=
              value * (new_pivotal_edge_weight * value + Kai * dseArray[jRow]);
          edge_weight[jRow] =
              max(kMinDualSteepestEdgeWeight, edge_weight[jRow]);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
      } else {
        // Devex
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          const double aa_iRow = colArray[iRow];
          edge_weight[jRow] = max(edge_weight[jRow],
                                  new_pivotal_edge_weight * aa_iRow * aa_iRow);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
        num_devex_iterations++;
      }
    }
  }
  checkNonUnitWeightError("999");
}